

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O2

void opengv::generateRandomCameraSystem
               (int numberCameras,translations_t *camOffsets,rotations_t *camRotations)

{
  uint uVar1;
  bool bVar2;
  translation_t camOffset;
  rotation_t camRotation;
  Vector3d VStack_88;
  value_type local_70;
  
  uVar1 = ~(numberCameras >> 0x1f) & numberCameras;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    generateRandomDirectionTranslation(&VStack_88,0.5);
    generateRandomRotation();
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back(camOffsets,&VStack_88);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::push_back(camRotations,&local_70);
  }
  return;
}

Assistant:

void
opengv::generateRandomCameraSystem(
    int numberCameras,
    translations_t & camOffsets,
    rotations_t & camRotations )
{
  double offset = 0.5; //this is the distance from the viewpoint origin

  for( int i = 0; i < numberCameras; i++ )
  {
    translation_t camOffset = generateRandomDirectionTranslation(offset);
    rotation_t camRotation = generateRandomRotation();
    camOffsets.push_back(camOffset);
    camRotations.push_back(camRotation);
  }
}